

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::RenameCommand(cmState *this,string *oldName,string *newName)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  *this_00;
  cmCommand *pcVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  string sNewName;
  string sOldName;
  string sStack_88;
  string local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_48;
  
  cmsys::SystemTools::LowerCase(&local_68,oldName);
  cmsys::SystemTools::LowerCase(&sStack_88,newName);
  this_00 = &this->Commands;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
          ::find(&this_00->_M_t,&local_68);
  p_Var3 = &(this->Commands)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var3) {
    pcVar1 = *(cmCommand **)(iVar2._M_node + 2);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
            ::find(&this_00->_M_t,&sStack_88);
    if ((_Rb_tree_header *)iVar2._M_node != p_Var3) {
      if (*(long **)(iVar2._M_node + 2) != (long *)0x0) {
        (**(code **)(**(long **)(iVar2._M_node + 2) + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                          *)this_00,iVar2);
    }
    std::__cxx11::string::string((string *)&local_48,(string *)&sStack_88);
    local_48.second = pcVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCommand*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                *)this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
            ::find(&this_00->_M_t,&local_68);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                        *)this_00,iVar2);
  }
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmState::RenameCommand(std::string const& oldName,
                            std::string const& newName)
{
  // if the command already exists, free the old one
  std::string sOldName = cmSystemTools::LowerCase(oldName);
  std::string sNewName = cmSystemTools::LowerCase(newName);
  std::map<std::string, cmCommand*>::iterator pos =
      this->Commands.find(sOldName);
  if ( pos == this->Commands.end() )
    {
    return;
    }
  cmCommand* cmd = pos->second;

  pos = this->Commands.find(sNewName);
  if (pos != this->Commands.end())
    {
    delete pos->second;
    this->Commands.erase(pos);
    }
  this->Commands.insert(std::make_pair(sNewName, cmd));
  pos = this->Commands.find(sOldName);
  this->Commands.erase(pos);
}